

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexBot.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::ComplexBot::ComplexBot(ComplexBot *this)

{
  (this->super_IBot)._vptr_IBot = (_func_int **)&PTR__ComplexBot_00183010;
  (this->listSubBot).
  super__Vector_base<tiger::trains::ai::ISubBot_*,_std::allocator<tiger::trains::ai::ISubBot_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->listSubBot).
  super__Vector_base<tiger::trains::ai::ISubBot_*,_std::allocator<tiger::trains::ai::ISubBot_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->listSubBot).
  super__Vector_base<tiger::trains::ai::ISubBot_*,_std::allocator<tiger::trains::ai::ISubBot_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BotSharedData::BotSharedData(&this->sharedData);
  return;
}

Assistant:

ComplexBot::ComplexBot()
{
}